

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::Initialize(Model *this)

{
  Gillespie *this_00;
  double *__args_2;
  string *__x;
  pointer pPVar1;
  __shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *pmVar3;
  ostream *poVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *pmVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  SpeciesTracker *pSVar8;
  _Base_ptr p_Var9;
  iterator iVar10;
  __shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pointer pPVar13;
  shared_ptr<BindPolymerase> reaction;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  promoter_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rbs_names;
  double rate_constant;
  double rate_constant_1;
  Polymerase pol_template;
  Polymerase pol;
  __shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2> local_2a0;
  __shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2> *local_290;
  undefined1 local_288 [80];
  undefined1 local_238 [8];
  undefined1 local_230 [32];
  size_t local_210;
  __shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2> local_208;
  mapped_type local_1f8;
  Ptr local_1f0;
  Ptr local_1e0;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_1d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_1b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_1a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_190 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_180 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_150 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_140 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  MobileElement local_130;
  MobileElement local_b0;
  
  p_Var11 = &((this->genomes_).
              super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>;
  local_290 = &((this->genomes_).
                super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>;
  if ((local_290 == p_Var11) &&
     ((this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->transcripts_).
      super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Warning: There are no Genome objects registered with Model. Did you forget to register a Genome?"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    p_Var11 = &((this->genomes_).
                super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>;
    local_290 = &((this->genomes_).
                  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>;
  }
  __x = &local_b0.name_;
  __args_2 = &this->cell_volume_;
  this_00 = &this->gillespie_;
  for (; p_Var11 != local_290; p_Var11 = p_Var11 + 1) {
    std::__shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2> *)local_238,p_Var11);
    pmVar5 = Genome::bindings_abi_cxx11_((Genome *)local_238);
    for (p_Var9 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)local_288,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)(p_Var9 + 1));
      pPVar1 = (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pPVar13 = (this->polymerases_).
                     super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                     super__Vector_impl_data._M_start; pPVar13 != pPVar1; pPVar13 = pPVar13 + 1) {
        Polymerase::Polymerase((Polymerase *)&local_b0,pPVar13);
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)(local_288 + 0x20),__x);
        if (sVar6 != 0) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)(local_288 + 0x20),__x);
          local_208._M_ptr = (element_type *)*pmVar7;
          Polymerase::Polymerase((Polymerase *)&local_130,(Polymerase *)&local_b0);
          std::make_shared<BindPolymerase,double&,double&,std::__cxx11::string_const&,Polymerase&>
                    ((double *)&local_2a0,(double *)&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_2,
                     (Polymerase *)local_288);
          pSVar8 = SpeciesTracker::Instance();
          std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindPolymerase,void>
                    (local_140,
                     (__shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2> *)&local_2a0);
          SpeciesTracker::Add(pSVar8,(string *)local_288,(Ptr *)local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
          std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindPolymerase,void>
                    (local_150,
                     (__shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2> *)&local_2a0);
          SpeciesTracker::Add(pSVar8,__x,(Ptr *)local_150);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
          std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindPolymerase,void>
                    (local_160,
                     (__shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2> *)&local_2a0);
          Gillespie::LinkReaction(this_00,(Ptr *)local_160);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0._M_refcount);
          MobileElement::~MobileElement(&local_130);
        }
        MobileElement::~MobileElement(&local_b0);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
               *)local_288);
    }
    if ((*(double *)((long)local_238 + 0x3f0) != 0.0) || (NAN(*(double *)((long)local_238 + 0x3f0)))
       ) {
      Rnase::Rnase((Rnase *)&local_b0,*(int *)((long)local_238 + 0x400),
                   *(double *)((long)local_238 + 0x3f8));
      std::make_shared<BindRnase,double_const&,double&,Rnase&,char_const(&)[17]>
                ((double *)local_288,(double *)((long)local_238 + 0x3f0),(Rnase *)__args_2,
                 (char (*) [17])&local_b0);
      pSVar8 = SpeciesTracker::Instance();
      std::__cxx11::string::string((string *)&local_130,"__rnase_site_ext",(allocator *)&local_2a0);
      std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                ((__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,
                 (__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      SpeciesTracker::Add(pSVar8,(string *)&local_130,&local_1e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1e0.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_130);
      std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                (local_170,(__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      Gillespie::LinkReaction(this_00,(Ptr *)local_170);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      MobileElement::~MobileElement(&local_b0);
    }
    if ((*(double *)((long)local_238 + 1000) != 0.0) || (NAN(*(double *)((long)local_238 + 1000))))
    {
      Rnase::Rnase((Rnase *)&local_b0,*(int *)((long)local_238 + 0x400),
                   *(double *)((long)local_238 + 0x3f8));
      std::make_shared<BindRnase,double_const&,double&,Rnase&,char_const(&)[13]>
                ((double *)local_288,(double *)((long)local_238 + 1000),(Rnase *)__args_2,
                 (char (*) [13])&local_b0);
      pSVar8 = SpeciesTracker::Instance();
      std::__cxx11::string::string((string *)&local_130,"__rnase_site",(allocator *)&local_2a0);
      std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                ((__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> *)&local_1f0,
                 (__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      SpeciesTracker::Add(pSVar8,(string *)&local_130,&local_1f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1f0.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_130);
      std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                (local_180,(__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      Gillespie::LinkReaction(this_00,(Ptr *)local_180);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      MobileElement::~MobileElement(&local_b0);
    }
    else if ((((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)((long)local_238 + 0x3b8))->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0
            ) {
      pmVar3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)((long)local_238 + 0x3b8);
      for (p_Var9 = (((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       *)((long)local_238 + 0x3b8))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)&local_130,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)(p_Var9 + 1));
        Rnase::Rnase((Rnase *)&local_b0,*(int *)((long)local_238 + 0x400),
                     *(double *)((long)local_238 + 0x3f8));
        std::make_shared<BindRnase,double&,double&,Rnase&,std::__cxx11::string_const&>
                  ((double *)local_288,(double *)&local_130.name_._M_string_length,(Rnase *)__args_2
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
        pSVar8 = SpeciesTracker::Instance();
        std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                  (local_190,(__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
        SpeciesTracker::Add(pSVar8,(string *)&local_130,(Ptr *)local_190);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188);
        std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BindRnase,void>
                  (local_1a0,(__shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2> *)local_288);
        Gillespie::LinkReaction(this_00,(Ptr *)local_1a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
        MobileElement::~MobileElement(&local_b0);
        std::__cxx11::string::~string((string *)&local_130);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_230);
  }
  local_230._0_4_ = _S_red;
  local_230._8_8_ = (_Base_ptr)0x0;
  local_230._16_8_ = local_230;
  local_210 = 0;
  p_Var2 = &((this->transcripts_).
             super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>;
  local_230._24_8_ = local_230._16_8_;
  for (p_Var12 = &((this->transcripts_).
                   super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>; p_Var12 != p_Var2;
      p_Var12 = p_Var12 + 1) {
    std::__shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2a0,p_Var12);
    pmVar5 = Transcript::bindings_abi_cxx11_(local_2a0._M_ptr);
    for (p_Var9 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)local_288,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)(p_Var9 + 1));
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238,(key_type *)local_288);
      if (iVar10._M_node == (_Base_ptr)local_230) {
        pPVar1 = (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar13 = (this->polymerases_).
                       super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
                       super__Vector_impl_data._M_start; pPVar13 != pPVar1; pPVar13 = pPVar13 + 1) {
          Polymerase::Polymerase((Polymerase *)&local_b0,pPVar13);
          sVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)(local_288 + 0x20),&local_b0.name_);
          if (sVar6 != 0) {
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)(local_288 + 0x20),&local_b0.name_);
            local_1f8 = *pmVar7;
            Polymerase::Polymerase((Polymerase *)&local_130,(Polymerase *)&local_b0);
            std::make_shared<BindPolymerase,double&,double&,std::__cxx11::string_const&,Polymerase&>
                      ((double *)&local_208,&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_2
                       ,(Polymerase *)local_288);
            pSVar8 = SpeciesTracker::Instance();
            std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<BindPolymerase,void>(local_1b0,&local_208);
            SpeciesTracker::Add(pSVar8,(string *)local_288,(Ptr *)local_1b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
            std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<BindPolymerase,void>(local_1c0,&local_208);
            SpeciesTracker::Add(pSVar8,&local_b0.name_,(Ptr *)local_1c0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
            std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<BindPolymerase,void>(local_1d0,&local_208);
            Gillespie::LinkReaction(this_00,(Ptr *)local_1d0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount)
            ;
            MobileElement::~MobileElement(&local_130);
          }
          MobileElement::~MobileElement(&local_b0);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
               *)local_288);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a0._M_refcount);
  }
  this->initialized_ = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
  return;
}

Assistant:

void Model::Initialize() {
  if (genomes_.size() == 0 && transcripts_.size() == 0) {
    std::cerr << "Warning: There are no Genome objects registered with "
                 "Model. Did you forget to register a Genome?"
              << std::endl;
  }
  // Create Bind reactions for each promoter-polymerase pair
  for (Genome::Ptr genome : genomes_) {
    for (auto promoter_name : genome->bindings()) {
      for (auto pol : polymerases_) {
        if (promoter_name.second.count(pol.name()) != 0) {
          double rate_constant = promoter_name.second[pol.name()];
          Polymerase pol_template = Polymerase(pol);
          auto reaction = std::make_shared<BindPolymerase>(
              rate_constant, cell_volume_, promoter_name.first, pol_template);
          auto &tracker = SpeciesTracker::Instance();
          tracker.Add(promoter_name.first, reaction);
          tracker.Add(pol.name(), reaction);
          gillespie_.LinkReaction(reaction);
        }
      }
    }
    // Create reaction for external rnase binding
    if (genome->transcript_degradation_rate_ext() != 0.0) {
      auto rnase_template_ext =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction_ext = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate_ext(), cell_volume_,
          rnase_template_ext, "__rnase_site_ext");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site_ext", reaction_ext);
      gillespie_.LinkReaction(reaction_ext);
    }
    
    // Create reaction for internal rnase binding
    if (genome->transcript_degradation_rate() != 0.0) {
      // TODO: user defined Rnase speed
      // auto rnase_template = Rnase(10, 30);
      auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate(), cell_volume_, rnase_template,
          "__rnase_site");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site", reaction);
      gillespie_.LinkReaction(reaction);
    } 
    
    // Alternatively, create bind reactions for individual rnase sites
    else if (genome->rnase_bindings().size() != 0) {
      for (auto rnase_site : genome->rnase_bindings()) {
        auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
        auto reaction = std::make_shared<BindRnase>(
          rnase_site.second, cell_volume_, rnase_template, rnase_site.first);
        auto &tracker = SpeciesTracker::Instance();
        tracker.Add(rnase_site.first, reaction);
        gillespie_.LinkReaction(reaction);
      }
    }
  }
  
  // Initialize transcripts that have been defined independently of genome
  std::set <std::string> rbs_names;
  for (Transcript::Ptr transcript : transcripts_) {
    for (auto rbs_name : transcript->bindings()) {
      if (rbs_names.find(rbs_name.first) == rbs_names.end()) { // only make reactions for unique RBS sites
        for (auto pol : polymerases_) {
          if (rbs_name.second.count(pol.name()) != 0) {
            double rate_constant = rbs_name.second[pol.name()];
            Polymerase pol_template = Polymerase(pol);
            auto reaction = std::make_shared<BindPolymerase>(
                rate_constant, cell_volume_, rbs_name.first, pol_template);
            auto &tracker = SpeciesTracker::Instance();
            tracker.Add(rbs_name.first, reaction);
            tracker.Add(pol.name(), reaction);
            gillespie_.LinkReaction(reaction);
          }
        }
        rbs_names.insert(rbs_name.first);
      }
    }
  }

  initialized_ = true;
}